

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>::operator()
          (bin_writer<3> *this,
          truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *it)

{
  bool in_R8B;
  truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> local_30;
  
  internal::
  format_uint<3u,wchar_t,fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,unsigned_long>
            (&local_30,*(internal **)this,*it,(ulong)*(uint *)(this + 8),0,in_R8B);
  *(ulong *)((long)&(it->super_truncating_iterator_base<wchar_t_*>).limit_ + 4) =
       CONCAT44((undefined4)local_30.super_truncating_iterator_base<wchar_t_*>.count_,
                local_30.super_truncating_iterator_base<wchar_t_*>.limit_._4_4_);
  *(undefined8 *)((long)&(it->super_truncating_iterator_base<wchar_t_*>).count_ + 4) =
       local_30._20_8_;
  (it->super_truncating_iterator_base<wchar_t_*>).out_ =
       local_30.super_truncating_iterator_base<wchar_t_*>.out_;
  (it->super_truncating_iterator_base<wchar_t_*>).limit_ =
       CONCAT44(local_30.super_truncating_iterator_base<wchar_t_*>.limit_._4_4_,
                (undefined4)local_30.super_truncating_iterator_base<wchar_t_*>.limit_);
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }